

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

ssize_t __thiscall
duckdb_parquet::DataPageHeader::read(DataPageHeader *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ssize_t sVar5;
  _func_int **pp_Var6;
  undefined8 *puVar7;
  ushort *__nbytes_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  int32_t ecast60;
  int16_t fid;
  TType ftype;
  string fname;
  type local_88;
  ushort local_82;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  DataPageHeader *local_70;
  int local_64;
  int32_t *local_60;
  Statistics *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_00);
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  iVar1 = (*this_00->_vptr_TProtocol[0x19])(this_00,&local_50);
  local_58 = &this->statistics;
  local_60 = &this->num_values;
  local_74 = 0;
  local_78 = 0;
  local_7c = 0;
  local_80 = 0;
  local_70 = this;
  do {
    __nbytes_00 = &local_82;
    iVar2 = (*this_00->_vptr_TProtocol[0x1b])(this_00,&local_50,&local_64);
    if (local_64 == 0) {
      iVar3 = (*this_00->_vptr_TProtocol[0x1a])(this_00);
      if (((((local_74 & 1) != 0) && ((local_78 & 1) != 0)) && ((local_7c & 1) != 0)) &&
         ((local_80 & 1) != 0)) {
        if (local_50 != local_40) {
          operator_delete(local_50);
        }
        this_00->input_recursion_depth_ = this_00->input_recursion_depth_ - 1;
        return (ulong)(uint)(iVar3 + iVar2 + iVar1);
      }
      puVar7 = (undefined8 *)__cxa_allocate_exception(0x30);
      puVar7[1] = puVar7 + 3;
      puVar7[2] = 0;
      *(undefined1 *)(puVar7 + 3) = 0;
      *puVar7 = &PTR__TException_024be1f0;
      *(undefined4 *)(puVar7 + 5) = 1;
      __cxa_throw(puVar7,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
                  duckdb_apache::thrift::TException::~TException);
    }
    switch(local_82) {
    case 1:
      pp_Var6 = this_00->_vptr_TProtocol;
      if (local_64 != 8) goto LAB_01cd29ad;
      iVar3 = (*pp_Var6[0x27])(this_00,local_60);
      local_74 = (uint)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
      goto LAB_01cd29b9;
    case 2:
      if (local_64 == 8) {
        iVar3 = (*this_00->_vptr_TProtocol[0x27])(this_00,&local_88);
        local_70->encoding = local_88;
        local_78 = (uint)CONCAT71((uint7)(uint3)(local_88 >> 8),1);
        goto LAB_01cd29b9;
      }
      break;
    case 3:
      if (local_64 == 8) {
        iVar3 = (*this_00->_vptr_TProtocol[0x27])(this_00,&local_88);
        local_70->definition_level_encoding = local_88;
        local_7c = (uint)CONCAT71((uint7)(uint3)(local_88 >> 8),1);
        goto LAB_01cd29b9;
      }
      break;
    case 4:
      if (local_64 == 8) {
        iVar3 = (*this_00->_vptr_TProtocol[0x27])(this_00,&local_88);
        local_70->repetition_level_encoding = local_88;
        local_80 = (uint)CONCAT71((uint7)(uint3)(local_88 >> 8),1);
        goto LAB_01cd29b9;
      }
      break;
    case 5:
      if (local_64 == 0xc) {
        sVar5 = Statistics::read(local_58,__fd,__buf_00,(size_t)__nbytes_00);
        iVar3 = (int)sVar5;
        local_70->__isset = (_DataPageHeader__isset)((byte)local_70->__isset | 1);
        goto LAB_01cd29b9;
      }
    }
    pp_Var6 = this_00->_vptr_TProtocol;
LAB_01cd29ad:
    iVar3 = (*pp_Var6[0x2c])(this_00);
LAB_01cd29b9:
    iVar4 = (*this_00->_vptr_TProtocol[0x1c])(this_00);
    iVar1 = iVar3 + iVar2 + iVar1 + iVar4;
  } while( true );
}

Assistant:

uint32_t DataPageHeader::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_num_values = false;
  bool isset_encoding = false;
  bool isset_definition_level_encoding = false;
  bool isset_repetition_level_encoding = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          xfer += iprot->readI32(this->num_values);
          isset_num_values = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          int32_t ecast59;
          xfer += iprot->readI32(ecast59);
          this->encoding = static_cast<Encoding::type>(ecast59);
          isset_encoding = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 3:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          int32_t ecast60;
          xfer += iprot->readI32(ecast60);
          this->definition_level_encoding = static_cast<Encoding::type>(ecast60);
          isset_definition_level_encoding = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 4:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          int32_t ecast61;
          xfer += iprot->readI32(ecast61);
          this->repetition_level_encoding = static_cast<Encoding::type>(ecast61);
          isset_repetition_level_encoding = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 5:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->statistics.read(iprot);
          this->__isset.statistics = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_num_values)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_encoding)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_definition_level_encoding)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_repetition_level_encoding)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}